

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O1

RK_U32 mpp_has_more_rbsp_data(BitReadCtx_t *bitctx)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  
  RVar1 = bitctx->bytes_left_;
  if (RVar1 != 0) {
    do {
      if (bitctx->data_[RVar1 - 1] != '\0') break;
      RVar1 = RVar1 - 1;
      bitctx->bytes_left_ = RVar1;
    } while (RVar1 != 0);
  }
  if ((bitctx->num_remaining_bits_in_curr_byte_ != 0) ||
     (MVar2 = (*bitctx->update_curbyte)(bitctx), MVar2 == MPP_OK)) {
    if (bitctx->bytes_left_ != 0) {
      return 1;
    }
    if (bitctx->num_remaining_bits_in_curr_byte_ != 0) {
      return (uint)(((uint)bitctx->curr_byte_ &
                    ~(-1 << ((char)bitctx->num_remaining_bits_in_curr_byte_ - 1U & 0x1f))) != 0);
    }
  }
  return 0;
}

Assistant:

RK_U32 mpp_has_more_rbsp_data(BitReadCtx_t *bitctx)
{
    // remove tail byte which equal zero
    while (bitctx->bytes_left_ &&
           bitctx->data_[bitctx->bytes_left_ - 1] == 0)
        bitctx->bytes_left_--;

    // Make sure we have more bits, if we are at 0 bits in current byte
    // and updating current byte fails, we don't have more data anyway.
    if (bitctx->num_remaining_bits_in_curr_byte_ == 0 && bitctx->update_curbyte(bitctx))
        return 0;
    // On last byte?
    if (bitctx->bytes_left_)
        return 1;
    // Last byte, look for stop bit;
    // We have more RBSP data if the last non-zero bit we find is not the
    // first available bit.
    if (bitctx->num_remaining_bits_in_curr_byte_)
        return (bitctx->curr_byte_ &
                ((1 << (bitctx->num_remaining_bits_in_curr_byte_ - 1)) - 1)) != 0;
    else
        return 0;
}